

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TreeEnsembleClassifier *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::TreeEnsembleClassifier>
          (Arena *arena)

{
  TreeEnsembleClassifier *pTVar1;
  
  if (arena != (Arena *)0x0) {
    pTVar1 = DoCreateMessage<CoreML::Specification::TreeEnsembleClassifier>(arena);
    return pTVar1;
  }
  pTVar1 = (TreeEnsembleClassifier *)operator_new(0x30);
  CoreML::Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar1,(Arena *)0x0,false);
  return pTVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }